

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_iterator.hpp
# Opt level: O3

void __thiscall
burst::
merge_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<int_*>_*,_std::vector<boost::iterator_range<int_*>,_std::allocator<boost::iterator_range<int_*>_>_>_>,_std::less<void>_>
::increment(merge_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<int_*>_*,_std::vector<boost::iterator_range<int_*>,_std::allocator<boost::iterator_range<int_*>_>_>_>,_std::less<void>_>
            *this)

{
  __normal_iterator<boost::iterator_range<int_*>_*,_std::vector<boost::iterator_range<int_*>,_std::allocator<boost::iterator_range<int_*>_>_>_>
  _Var1;
  iterator_range_base<int_*,_boost::iterators::incrementable_traversal_tag> __value;
  iterator_range<int_*> *piVar2;
  int *piVar3;
  _Iter_comp_val<burst::compose_fn<burst::apply_fn<burst::invert_t<std::less<void>_>_>,_burst::compose_fn<burst::by_all_fn<burst::front_t>,_burst::forward_as_tuple_fn>_>_>
  __cmp;
  _Iter_comp_iter<burst::compose_fn<burst::apply_fn<burst::invert_t<std::less<void>_>_>,_burst::compose_fn<burst::by_all_fn<burst::front_t>,_burst::forward_as_tuple_fn>_>_>
  in_stack_ffffffffffffffe8;
  _Iter_comp_val<burst::compose_fn<burst::apply_fn<burst::invert_t<std::less<void>_>_>,_burst::compose_fn<burst::by_all_fn<burst::front_t>,_burst::forward_as_tuple_fn>_>_>
  local_b;
  
  _Var1._M_current = (this->m_begin)._M_current;
  piVar2 = (this->m_end)._M_current;
  if (0x10 < (long)piVar2 - (long)_Var1._M_current) {
    __value = piVar2[-1].
              super_iterator_range_base<int_*,_boost::iterators::random_access_traversal_tag>.
              super_iterator_range_base<int_*,_boost::iterators::bidirectional_traversal_tag>.
              super_iterator_range_base<int_*,_boost::iterators::incrementable_traversal_tag>;
    piVar3 = ((_Var1._M_current)->
             super_iterator_range_base<int_*,_boost::iterators::random_access_traversal_tag>).
             super_iterator_range_base<int_*,_boost::iterators::bidirectional_traversal_tag>.
             super_iterator_range_base<int_*,_boost::iterators::incrementable_traversal_tag>.m_End;
    piVar2[-1].super_iterator_range_base<int_*,_boost::iterators::random_access_traversal_tag>.
    super_iterator_range_base<int_*,_boost::iterators::bidirectional_traversal_tag>.
    super_iterator_range_base<int_*,_boost::iterators::incrementable_traversal_tag>.m_Begin =
         ((_Var1._M_current)->
         super_iterator_range_base<int_*,_boost::iterators::random_access_traversal_tag>).
         super_iterator_range_base<int_*,_boost::iterators::bidirectional_traversal_tag>.
         super_iterator_range_base<int_*,_boost::iterators::incrementable_traversal_tag>.m_Begin;
    piVar2[-1].super_iterator_range_base<int_*,_boost::iterators::random_access_traversal_tag>.
    super_iterator_range_base<int_*,_boost::iterators::bidirectional_traversal_tag>.
    super_iterator_range_base<int_*,_boost::iterators::incrementable_traversal_tag>.m_End = piVar3;
    std::
    __adjust_heap<__gnu_cxx::__normal_iterator<boost::iterator_range<int*>*,std::vector<boost::iterator_range<int*>,std::allocator<boost::iterator_range<int*>>>>,long,boost::iterator_range<int*>,__gnu_cxx::__ops::_Iter_comp_iter<burst::compose_fn<burst::apply_fn<burst::invert_t<std::less<void>>>,burst::compose_fn<burst::by_all_fn<burst::front_t>,burst::forward_as_tuple_fn>>>>
              (_Var1,0,(long)piVar2 + (-0x10 - (long)_Var1._M_current) >> 4,
               (iterator_range<int_*>)__value,in_stack_ffffffffffffffe8);
    piVar2 = (this->m_end)._M_current;
  }
  piVar3 = piVar2[-1].
           super_iterator_range_base<int_*,_boost::iterators::random_access_traversal_tag>.
           super_iterator_range_base<int_*,_boost::iterators::bidirectional_traversal_tag>.
           super_iterator_range_base<int_*,_boost::iterators::incrementable_traversal_tag>.m_Begin +
           1;
  piVar2[-1].super_iterator_range_base<int_*,_boost::iterators::random_access_traversal_tag>.
  super_iterator_range_base<int_*,_boost::iterators::bidirectional_traversal_tag>.
  super_iterator_range_base<int_*,_boost::iterators::incrementable_traversal_tag>.m_Begin = piVar3;
  if (piVar3 == piVar2[-1].
                super_iterator_range_base<int_*,_boost::iterators::random_access_traversal_tag>.
                super_iterator_range_base<int_*,_boost::iterators::bidirectional_traversal_tag>.
                super_iterator_range_base<int_*,_boost::iterators::incrementable_traversal_tag>.
                m_End) {
    (this->m_end)._M_current = (this->m_end)._M_current + -1;
  }
  else {
    _Var1._M_current = (this->m_begin)._M_current;
    piVar2 = (this->m_end)._M_current;
    std::
    __push_heap<__gnu_cxx::__normal_iterator<boost::iterator_range<int*>*,std::vector<boost::iterator_range<int*>,std::allocator<boost::iterator_range<int*>>>>,long,boost::iterator_range<int*>,__gnu_cxx::__ops::_Iter_comp_val<burst::compose_fn<burst::apply_fn<burst::invert_t<std::less<void>>>,burst::compose_fn<burst::by_all_fn<burst::front_t>,burst::forward_as_tuple_fn>>>>
              (_Var1,((long)piVar2 - (long)_Var1._M_current >> 4) + -1,0,
               (iterator_range<int_*>)
               piVar2[-1].
               super_iterator_range_base<int_*,_boost::iterators::random_access_traversal_tag>.
               super_iterator_range_base<int_*,_boost::iterators::bidirectional_traversal_tag>.
               super_iterator_range_base<int_*,_boost::iterators::incrementable_traversal_tag>,
               &local_b);
  }
  return;
}

Assistant:

void increment ()
        {
            std::pop_heap(m_begin, m_end, each(front) | invert(m_compare));
            auto & range = *std::prev(m_end);

            range.advance_begin(1);
            if (not range.empty())
            {
                std::push_heap(m_begin, m_end, each(front) | invert(m_compare));
            }
            else
            {
                --m_end;
            }
        }